

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_fdset(CURLM *m,fd_set *read_fd_set,fd_set *write_fd_set,fd_set *exc_fd_set,
                          int *max_fd)

{
  _Bool _Var1;
  undefined1 local_78 [8];
  easy_pollset ps;
  Curl_easy *data;
  uint mid;
  uint i;
  Curl_multi *multi;
  int *piStack_38;
  int this_max_fd;
  int *max_fd_local;
  fd_set *exc_fd_set_local;
  fd_set *write_fd_set_local;
  fd_set *read_fd_set_local;
  CURLM *m_local;
  
  multi._4_4_ = -1;
  if ((m == (CURLM *)0x0) || (*m != 0xbab1e)) {
    m_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((*(byte *)((long)m + 0x271) >> 2 & 1) == 0) {
    _mid = (Curl_multi *)m;
    piStack_38 = max_fd;
    max_fd_local = (int *)exc_fd_set;
    exc_fd_set_local = write_fd_set;
    write_fd_set_local = read_fd_set;
    read_fd_set_local = (fd_set *)m;
    _Var1 = Curl_uint_bset_first((uint_bset *)((long)m + 0x28),(uint *)&data);
    if (_Var1) {
      do {
        ps._24_8_ = Curl_multi_get_easy(_mid,(uint)data);
        if ((Curl_easy *)ps._24_8_ != (Curl_easy *)0x0) {
          Curl_multi_getsock((Curl_easy *)ps._24_8_,(easy_pollset *)local_78,"curl_multi_fdset");
          for (data._4_4_ = 0; data._4_4_ < (uint)ps.sockets[3]; data._4_4_ = data._4_4_ + 1) {
            if (*(int *)(local_78 + (ulong)data._4_4_ * 4) < 0x400) {
              if ((*(byte *)((long)ps.sockets + (ulong)data._4_4_ + 0x10) & 1) != 0) {
                write_fd_set_local->fds_bits[*(int *)(local_78 + (ulong)data._4_4_ * 4) / 0x40] =
                     1L << ((byte)((long)*(int *)(local_78 + (ulong)data._4_4_ * 4) % 0x40) & 0x3f)
                     | write_fd_set_local->fds_bits
                       [*(int *)(local_78 + (ulong)data._4_4_ * 4) / 0x40];
              }
              if ((*(byte *)((long)ps.sockets + (ulong)data._4_4_ + 0x10) & 2) != 0) {
                exc_fd_set_local->fds_bits[*(int *)(local_78 + (ulong)data._4_4_ * 4) / 0x40] =
                     1L << ((byte)((long)*(int *)(local_78 + (ulong)data._4_4_ * 4) % 0x40) & 0x3f)
                     | exc_fd_set_local->fds_bits[*(int *)(local_78 + (ulong)data._4_4_ * 4) / 0x40]
                ;
              }
              if (multi._4_4_ < *(int *)(local_78 + (ulong)data._4_4_ * 4)) {
                multi._4_4_ = *(int *)(local_78 + (ulong)data._4_4_ * 4);
              }
            }
          }
        }
        _Var1 = Curl_uint_bset_next(&_mid->process,(uint)data,(uint *)&data);
      } while (_Var1);
    }
    Curl_cshutdn_setfds(&_mid->cshutdn,_mid->admin,write_fd_set_local,exc_fd_set_local,
                        (int *)((long)&multi + 4));
    *piStack_38 = multi._4_4_;
    m_local._4_4_ = CURLM_OK;
  }
  else {
    m_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return m_local._4_4_;
}

Assistant:

CURLMcode curl_multi_fdset(CURLM *m,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_multi *multi = m;
  unsigned int i, mid;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  if(Curl_uint_bset_first(&multi->process, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      struct easy_pollset ps;

      if(!data) {
        DEBUGASSERT(0);
        continue;
      }

      Curl_multi_getsock(data, &ps, "curl_multi_fdset");
      for(i = 0; i < ps.num; i++) {
        if(!FDSET_SOCK(ps.sockets[i]))
          /* pretend it does not exist */
          continue;
#if defined(__DJGPP__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warith-conversion"
#endif
        if(ps.actions[i] & CURL_POLL_IN)
          FD_SET(ps.sockets[i], read_fd_set);
        if(ps.actions[i] & CURL_POLL_OUT)
          FD_SET(ps.sockets[i], write_fd_set);
#if defined(__DJGPP__)
#pragma GCC diagnostic pop
#endif
        if((int)ps.sockets[i] > this_max_fd)
          this_max_fd = (int)ps.sockets[i];
      }
    }
    while(Curl_uint_bset_next(&multi->process, mid, &mid));
  }

  Curl_cshutdn_setfds(&multi->cshutdn, multi->admin,
                      read_fd_set, write_fd_set, &this_max_fd);

  *max_fd = this_max_fd;

  return CURLM_OK;
}